

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsql_sqlite.cpp
# Opt level: O3

int __thiscall QSQLiteDriver::open(QSQLiteDriver *this,char *__file,int __oflag,...)

{
  QStringView *pQVar1;
  long lVar2;
  sqlite3 *descr;
  int *piVar3;
  bool bVar4;
  undefined1 *puVar5;
  char cVar6;
  byte bVar7;
  bool bVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  CutResult CVar12;
  int iVar13;
  long lVar14;
  void *p;
  undefined8 *puVar15;
  undefined8 uVar16;
  QArrayData *pQVar17;
  byte bVar18;
  uint uVar19;
  bool bVar20;
  long lVar21;
  storage_type *psVar22;
  sqlite3_vfs *psVar23;
  Db *filename;
  long lVar24;
  sqlite3 **ppDb;
  char *zVfs;
  long in_FS_OFFSET;
  bool bVar25;
  QLatin1String QVar26;
  QStringView QVar27;
  QLatin1String QVar28;
  QStringView QVar29;
  QLatin1String QVar30;
  QLatin1String QVar31;
  QLatin1String QVar32;
  QLatin1String QVar33;
  QLatin1String QVar34;
  QStringView QVar35;
  QLatin1String QVar36;
  QStringView QVar37;
  QStringView QVar38;
  QStringView QVar39;
  QStringView QVar40;
  QStringView QVar41;
  QStringView QVar42;
  QStringView QVar43;
  QLatin1String QVar44;
  QStringView QVar45;
  long in_stack_00000008;
  bool ok_1;
  bool ok;
  int local_104;
  uint local_100;
  int local_fc;
  undefined1 local_a8 [24];
  QString local_90;
  char *local_78;
  bool local_69;
  QStringView local_68;
  QArrayData *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  long local_38;
  qsizetype originalLength;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  cVar6 = (**(code **)(*(long *)this + 0x60))(this,__file,___oflag);
  if (cVar6 != '\0') {
    (**(code **)(*(long *)this + 0xc0))(this);
  }
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = (QArrayData *)&DAT_aaaaaaaaaaaaaaaa;
  puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
  local_90.d.ptr = *(char16_t **)(in_stack_00000008 + 8);
  local_90.d.d._0_4_ = (uint)*(undefined8 *)(in_stack_00000008 + 0x10);
  local_90.d.d._4_4_ = (undefined4)((ulong)*(undefined8 *)(in_stack_00000008 + 0x10) >> 0x20);
  QStringView::split(&local_58,local_a8 + 0x18,0x3b,1);
  puVar5 = puStack_50;
  QVar45.m_data = local_68.m_data;
  QVar45.m_size = local_68.m_size;
  if (local_48 == (undefined1 *)0x0) {
    uVar19 = 0x40006;
    local_fc = 5000;
    local_104 = 1;
    local_100 = 0x19;
    bVar11 = 0;
    bVar20 = false;
    zVfs = (char *)0x0;
  }
  else {
    lVar21 = (long)local_48 << 4;
    local_100 = 0x19;
    local_104 = 1;
    local_fc = 5000;
    lVar24 = 0;
    bVar9 = 0;
    bVar7 = 0;
    bVar8 = false;
    bVar10 = false;
    bVar20 = false;
    bVar4 = false;
    bVar11 = 0;
    do {
      pQVar1 = (QStringView *)(puVar5 + lVar24);
      local_68.m_size = pQVar1->m_size;
      local_68.m_data = pQVar1->m_data;
      QVar45 = (QStringView)QtPrivate::trimmed(*pQVar1);
      psVar22 = QVar45.m_data;
      originalLength = QVar45.m_size;
      QVar36.m_data = "QSQLITE_BUSY_TIMEOUT";
      QVar36.m_size = 0x14;
      local_68 = QVar45;
      cVar6 = QtPrivate::startsWith(QVar45,QVar36,CaseSensitive);
      iVar13 = local_fc;
      if (cVar6 != '\0') {
        local_90.d.d._0_4_ = 0x14;
        local_90.d.d._4_4_ = 0;
        local_a8._0_8_ = (sqlite3_vfs *)0xffffffffffffffff;
        CVar12 = QtPrivate::QContainerImplHelper::mid
                           (originalLength,(qsizetype *)(local_a8 + 0x18),(qsizetype *)local_a8);
        if (CVar12 == Null) {
          psVar23 = (sqlite3_vfs *)0x0;
          psVar22 = (storage_type *)0x0;
        }
        else {
          psVar22 = local_68.m_data + CONCAT44(local_90.d.d._4_4_,(uint)local_90.d.d);
          psVar23 = (sqlite3_vfs *)local_a8._0_8_;
        }
        QVar27.m_data = psVar22;
        QVar27.m_size = (qsizetype)psVar23;
        QVar45 = (QStringView)QtPrivate::trimmed(QVar27);
        if ((QVar45.m_size != 0) && (*QVar45.m_data == L'=')) {
          local_69 = true;
          local_90.d.d._0_4_ = 1;
          local_90.d.d._4_4_ = 0;
          local_a8._0_8_ = (sqlite3_vfs *)0xffffffffffffffff;
          local_68 = QVar45;
          CVar12 = QtPrivate::QContainerImplHelper::mid
                             (QVar45.m_size,(qsizetype *)(local_a8 + 0x18),(qsizetype *)local_a8);
          if (CVar12 == Null) {
            psVar23 = (sqlite3_vfs *)0x0;
            psVar22 = (storage_type *)0x0;
          }
          else {
            psVar22 = local_68.m_data + CONCAT44(local_90.d.d._4_4_,(uint)local_90.d.d);
            psVar23 = (sqlite3_vfs *)local_a8._0_8_;
          }
          QVar29.m_data = psVar22;
          QVar29.m_size = (qsizetype)psVar23;
          QVar45 = (QStringView)QtPrivate::trimmed(QVar29);
          lVar14 = QString::toIntegral_helper(QVar45,&local_69,10);
          if ((local_69 & 1U) != 0) {
            iVar13 = (int)lVar14;
          }
          QVar45 = local_68;
          if ((int)lVar14 != lVar14) {
            iVar13 = local_fc;
          }
        }
        goto LAB_0011494a;
      }
      if (originalLength < 0x1b) {
        if (originalLength == 0x10) {
          QVar30.m_data = "QSQLITE_OPEN_URI";
          QVar30.m_size = 0x10;
          QVar39.m_data = psVar22;
          QVar39.m_size = 0x10;
          cVar6 = QtPrivate::equalStrings(QVar30,QVar39);
          if (cVar6 != '\0') {
            bVar8 = true;
            QVar45 = local_68;
            goto LAB_0011494a;
          }
          goto LAB_00114777;
        }
        if (originalLength == 0x12) {
          QVar32.m_data = "QSQLITE_USE_QT_VFS";
          QVar32.m_size = 0x12;
          QVar41.m_data = psVar22;
          QVar41.m_size = 0x12;
          cVar6 = QtPrivate::equalStrings(QVar32,QVar41);
          if (cVar6 != '\0') {
            bVar10 = true;
            QVar45 = local_68;
            goto LAB_0011494a;
          }
          goto LAB_00114777;
        }
        if (originalLength != 0x15) goto LAB_00114777;
        QVar26.m_data = "QSQLITE_OPEN_READONLY";
        QVar26.m_size = 0x15;
        QVar37.m_data = psVar22;
        QVar37.m_size = 0x15;
        cVar6 = QtPrivate::equalStrings(QVar26,QVar37);
        if (cVar6 == '\0') {
          QVar34.m_data = "QSQLITE_OPEN_NOFOLLOW";
          QVar34.m_size = 0x15;
          QVar43.m_data = psVar22;
          QVar43.m_size = 0x15;
          cVar6 = QtPrivate::equalStrings(QVar34,QVar43);
          if (cVar6 == '\0') goto LAB_00114777;
          bVar4 = true;
          QVar45 = local_68;
        }
        else {
          bVar7 = 1;
          QVar45 = local_68;
        }
      }
      else {
        if (originalLength == 0x1b) {
          QVar31.m_data = "QSQLITE_ENABLE_SHARED_CACHE";
          QVar31.m_size = 0x1b;
          QVar40.m_data = psVar22;
          QVar40.m_size = 0x1b;
          cVar6 = QtPrivate::equalStrings(QVar31,QVar40);
          if (cVar6 != '\0') {
            bVar9 = 1;
            QVar45 = local_68;
            goto LAB_0011494a;
          }
        }
        else if (originalLength == 0x24) {
          QVar33.m_data = "QSQLITE_NO_USE_EXTENDED_RESULT_CODES";
          QVar33.m_size = 0x24;
          QVar42.m_data = psVar22;
          QVar42.m_size = 0x24;
          cVar6 = QtPrivate::equalStrings(QVar33,QVar42);
          if (cVar6 != '\0') {
            local_104 = 0;
            QVar45 = local_68;
            goto LAB_0011494a;
          }
        }
        else if (originalLength == 0x25) {
          QVar28.m_data = "QSQLITE_ENABLE_NON_ASCII_CASE_FOLDING";
          QVar28.m_size = 0x25;
          QVar38.m_data = psVar22;
          QVar38.m_size = 0x25;
          cVar6 = QtPrivate::equalStrings(QVar28,QVar38);
          if (cVar6 != '\0') {
            bVar20 = true;
            QVar45 = local_68;
            goto LAB_0011494a;
          }
        }
LAB_00114777:
        QVar44.m_data = "QSQLITE_ENABLE_REGEXP";
        QVar44.m_size = 0x15;
        cVar6 = QtPrivate::startsWith(QVar45,QVar44,CaseSensitive);
        if (cVar6 == '\0') {
          lcSqlite();
          QVar45 = local_68;
          if (((byte)lcSqlite::category.field_2.bools.enabledWarning._q_value._M_base._M_i & 1) != 0
             ) {
            local_90.d.d._0_4_ = 2;
            local_90.d.d._4_4_ = 0;
            local_90.d.ptr = (char16_t *)0x0;
            local_90.d.size._0_4_ = 0;
            local_90.d.size._4_4_ = 0;
            local_78 = lcSqlite::category.name;
            QString::QString((QString *)local_a8,(QChar *)local_68.m_data,local_68.m_size);
            uVar16 = QString::utf16();
            QMessageLogger::warning(local_a8 + 0x18,"Unsupported option \'%ls\'",uVar16);
            QVar45 = local_68;
            if ((sqlite3_vfs *)local_a8._0_8_ != (sqlite3_vfs *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i +
                   -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_a8._0_8_)->_q_value).super___atomic_base<int>._M_i == 0
                 ) {
                QArrayData::deallocate((QArrayData *)local_a8._0_8_,2,0x10);
                QVar45 = local_68;
              }
            }
          }
        }
        else {
          local_90.d.d._0_4_ = 0x15;
          local_90.d.d._4_4_ = 0;
          local_a8._0_8_ = (sqlite3_vfs *)0xffffffffffffffff;
          CVar12 = QtPrivate::QContainerImplHelper::mid
                             (originalLength,(qsizetype *)(local_a8 + 0x18),(qsizetype *)local_a8);
          if (CVar12 == Null) {
            psVar23 = (sqlite3_vfs *)0x0;
            psVar22 = (storage_type *)0x0;
          }
          else {
            psVar22 = local_68.m_data + CONCAT44(local_90.d.d._4_4_,(uint)local_90.d.d);
            psVar23 = (sqlite3_vfs *)local_a8._0_8_;
          }
          QVar35.m_data = psVar22;
          QVar35.m_size = (qsizetype)psVar23;
          QVar45 = (QStringView)QtPrivate::trimmed(QVar35);
          if (QVar45.m_size == 0) {
            bVar11 = 1;
          }
          else if (*QVar45.m_data == L'=') {
            local_90.d.d._0_4_ = (uint)local_90.d.d & 0xffffff00;
            local_68 = QVar45;
            QVar45 = QStringView::mid(&local_68,1,-1);
            QVar45 = (QStringView)QtPrivate::trimmed(QVar45);
            lVar14 = QString::toIntegral_helper(QVar45,(bool *)(local_a8 + 0x18),10);
            bVar25 = (int)lVar14 == lVar14;
            if (!bVar25) {
              lVar14 = 0;
            }
            bVar18 = bVar25 & (byte)local_90.d.d;
            uVar19 = local_100;
            if (bVar18 != 0) {
              uVar19 = (uint)lVar14;
            }
            if (0 < lVar14) {
              local_100 = uVar19;
            }
            bVar11 = bVar11 | bVar18;
            QVar45 = local_68;
          }
        }
      }
LAB_0011494a:
      local_fc = iVar13;
      lVar24 = lVar24 + 0x10;
    } while (lVar21 != lVar24);
    uVar19 = ((byte)~bVar9 & 1) * 0x20000 + ((byte)~bVar7 & 1) * 5 + 0x20001;
    zVfs = (char *)0x0;
    if (bVar10) {
      zVfs = "QtVFS";
    }
    if (bVar8) {
      if (bVar4) {
        uVar19 = uVar19 | 0x1000040;
      }
      else {
        uVar19 = uVar19 | 0x40;
      }
    }
    else if (bVar4) {
      uVar19 = uVar19 | 0x1000000;
    }
  }
  local_68 = QVar45;
  QString::toUtf8_helper((QString *)(local_a8 + 0x18));
  filename = (Db *)local_90.d.ptr;
  if ((Db *)local_90.d.ptr == (Db *)0x0) {
    filename = (Db *)&QByteArray::_empty;
  }
  ppDb = (sqlite3 **)(lVar2 + 0xa8);
  iVar13 = sqlite3_open_v2((char *)filename,ppDb,uVar19 | 0x8000,zVfs);
  piVar3 = (int *)CONCAT44(local_90.d.d._4_4_,(uint)local_90.d.d);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_90.d.d._4_4_,(uint)local_90.d.d),1,0x10);
    }
  }
  if (iVar13 == 0) {
    sqlite3_busy_timeout(*ppDb,local_fc);
    sqlite3_extended_result_codes(*ppDb,local_104);
    (**(code **)(*(long *)this + 0x110))(this,1);
    (**(code **)(*(long *)this + 0x118))(this,0);
    if (bVar11 != 0) {
      p = operator_new(0x48);
      *(void **)p = p;
      *(void **)((long)p + 8) = p;
      *(undefined4 *)((long)p + 0x10) = 1;
      *(undefined1 (*) [16])((long)p + 0x18) = (undefined1  [16])0x0;
      *(undefined8 *)((long)p + 0x28) = 0;
      *(undefined8 *)((long)p + 0x20) = 0x80;
      puVar15 = (undefined8 *)operator_new__(0x98);
      *puVar15 = 1;
      puVar15[0x11] = 0;
      *(undefined2 *)(puVar15 + 0x12) = 0;
      *(undefined4 *)(puVar15 + 1) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0xc) = 0xffffffff;
      *(undefined4 *)(puVar15 + 2) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x14) = 0xffffffff;
      *(undefined4 *)(puVar15 + 3) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x1c) = 0xffffffff;
      *(undefined4 *)(puVar15 + 4) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x24) = 0xffffffff;
      *(undefined4 *)(puVar15 + 5) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x2c) = 0xffffffff;
      *(undefined4 *)(puVar15 + 6) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x34) = 0xffffffff;
      *(undefined4 *)(puVar15 + 7) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x3c) = 0xffffffff;
      *(undefined4 *)(puVar15 + 8) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x44) = 0xffffffff;
      *(undefined4 *)(puVar15 + 9) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x4c) = 0xffffffff;
      *(undefined4 *)(puVar15 + 10) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x54) = 0xffffffff;
      *(undefined4 *)(puVar15 + 0xb) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x5c) = 0xffffffff;
      *(undefined4 *)(puVar15 + 0xc) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 100) = 0xffffffff;
      *(undefined4 *)(puVar15 + 0xd) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x6c) = 0xffffffff;
      *(undefined4 *)(puVar15 + 0xe) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x74) = 0xffffffff;
      *(undefined4 *)(puVar15 + 0xf) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x7c) = 0xffffffff;
      *(undefined4 *)(puVar15 + 0x10) = 0xffffffff;
      *(undefined4 *)((long)puVar15 + 0x84) = 0xffffffff;
      *(undefined8 **)((long)p + 0x30) = puVar15 + 1;
      uVar16 = QHashSeed::globalSeed();
      *(undefined8 *)((long)p + 0x28) = uVar16;
      *(ulong *)((long)p + 0x38) = (ulong)local_100;
      *(undefined8 *)((long)p + 0x40) = 0;
      sqlite3_create_function_v2
                (*ppDb,"regexp",2,1,p,_q_regexp,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                 (_func_void_sqlite3_context_ptr *)0x0,_q_regexp_cleanup);
    }
    if (bVar20) {
      sqlite3_create_function_v2
                (*ppDb,"lower",1,1,(void *)0x0,_q_lower,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                 (_func_void_sqlite3_context_ptr *)0x0,(_func_void_void_ptr *)0x0);
      sqlite3_create_function_v2
                (*ppDb,"upper",1,1,(void *)0x0,_q_upper,
                 (_func_void_sqlite3_context_ptr_int_sqlite3_value_ptr_ptr *)0x0,
                 (_func_void_sqlite3_context_ptr *)0x0,(_func_void_void_ptr *)0x0);
    }
  }
  else {
    descr = *ppDb;
    QMetaObject::tr(local_a8 + 0x18,(char *)&staticMetaObject,0x1ff409);
    qMakeError((sqlite3 *)local_a8,(QString *)descr,(ErrorType)(local_a8 + 0x18),1);
    (**(code **)(*(long *)this + 0x120))(this,(sqlite3 *)local_a8);
    QSqlError::~QSqlError((QSqlError *)local_a8);
    piVar3 = (int *)CONCAT44(local_90.d.d._4_4_,(uint)local_90.d.d);
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_90.d.d._4_4_,(uint)local_90.d.d),2,0x10)
        ;
      }
    }
    (**(code **)(*(long *)this + 0x118))(this,1);
    if (*ppDb != (sqlite3 *)0x0) {
      sqlite3_close(*ppDb);
      *ppDb = (sqlite3 *)0x0;
    }
  }
  pQVar17 = local_58;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      pQVar17 = (QArrayData *)QArrayData::deallocate(local_58,0x10,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return (int)CONCAT71((int7)((ulong)pQVar17 >> 8),iVar13 == 0);
}

Assistant:

bool QSQLiteDriver::open(const QString & db, const QString &, const QString &, const QString &, int, const QString &conOpts)
{
    Q_D(QSQLiteDriver);
    if (isOpen())
        close();


    int timeOut = 5000;
    bool sharedCache = false;
    bool openReadOnlyOption = false;
    bool openUriOption = false;
    bool useExtendedResultCodes = true;
    bool useQtVfs = false;
    bool useQtCaseFolding = false;
    bool openNoFollow = false;
#if QT_CONFIG(regularexpression)
    static const auto regexpConnectOption = "QSQLITE_ENABLE_REGEXP"_L1;
    bool defineRegexp = false;
    int regexpCacheSize = 25;
#endif

    const auto opts = QStringView{conOpts}.split(u';', Qt::SkipEmptyParts);
    for (auto option : opts) {
        option = option.trimmed();
        if (option.startsWith("QSQLITE_BUSY_TIMEOUT"_L1)) {
            option = option.mid(20).trimmed();
            if (option.startsWith(u'=')) {
                bool ok;
                const int nt = option.mid(1).trimmed().toInt(&ok);
                if (ok)
                    timeOut = nt;
            }
        } else if (option == "QSQLITE_USE_QT_VFS"_L1) {
            useQtVfs = true;
        } else if (option == "QSQLITE_OPEN_READONLY"_L1) {
            openReadOnlyOption = true;
        } else if (option == "QSQLITE_OPEN_URI"_L1) {
            openUriOption = true;
        } else if (option == "QSQLITE_ENABLE_SHARED_CACHE"_L1) {
            sharedCache = true;
        } else if (option == "QSQLITE_NO_USE_EXTENDED_RESULT_CODES"_L1) {
            useExtendedResultCodes = false;
        } else if (option == "QSQLITE_ENABLE_NON_ASCII_CASE_FOLDING"_L1) {
            useQtCaseFolding = true;
        } else if (option == "QSQLITE_OPEN_NOFOLLOW"_L1) {
            openNoFollow = true;
        }
#if QT_CONFIG(regularexpression)
        else if (option.startsWith(regexpConnectOption)) {
            option = option.mid(regexpConnectOption.size()).trimmed();
            if (option.isEmpty()) {
                defineRegexp = true;
            } else if (option.startsWith(u'=')) {
                bool ok = false;
                const int cacheSize = option.mid(1).trimmed().toInt(&ok);
                if (ok) {
                    defineRegexp = true;
                    if (cacheSize > 0)
                        regexpCacheSize = cacheSize;
                }
            }
        }
#endif
        else
            qCWarning(lcSqlite, "Unsupported option '%ls'", qUtf16Printable(option.toString()));
    }

    int openMode = (openReadOnlyOption ? SQLITE_OPEN_READONLY : (SQLITE_OPEN_READWRITE | SQLITE_OPEN_CREATE));
    openMode |= (sharedCache ? SQLITE_OPEN_SHAREDCACHE : SQLITE_OPEN_PRIVATECACHE);
    if (openUriOption)
        openMode |= SQLITE_OPEN_URI;
    if (openNoFollow) {
#if defined(SQLITE_OPEN_NOFOLLOW)
        openMode |= SQLITE_OPEN_NOFOLLOW;
#else
        qCWarning(lcSqlite, "SQLITE_OPEN_NOFOLLOW not supported with the SQLite version %s", sqlite3_libversion());
#endif
    }

    openMode |= SQLITE_OPEN_NOMUTEX;

    const int res = sqlite3_open_v2(db.toUtf8().constData(), &d->access, openMode, useQtVfs ? "QtVFS" : nullptr);

    if (res == SQLITE_OK) {
        sqlite3_busy_timeout(d->access, timeOut);
        sqlite3_extended_result_codes(d->access, useExtendedResultCodes);
        setOpen(true);
        setOpenError(false);
#if QT_CONFIG(regularexpression)
        if (defineRegexp) {
            auto cache = new QCache<QString, QRegularExpression>(regexpCacheSize);
            sqlite3_create_function_v2(d->access, "regexp", 2, SQLITE_UTF8, cache,
                                       &_q_regexp, nullptr,
                                       nullptr, &_q_regexp_cleanup);
        }
#endif
        if (useQtCaseFolding) {
            sqlite3_create_function_v2(d->access, "lower", 1, SQLITE_UTF8, nullptr,
                                       &_q_lower, nullptr, nullptr, nullptr);
            sqlite3_create_function_v2(d->access, "upper", 1, SQLITE_UTF8, nullptr,
                                       &_q_upper, nullptr, nullptr, nullptr);
        }
        return true;
    } else {
        setLastError(qMakeError(d->access, tr("Error opening database"),
                     QSqlError::ConnectionError, res));
        setOpenError(true);

        if (d->access) {
            sqlite3_close(d->access);
            d->access = nullptr;
        }

        return false;
    }
}